

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# execmd.c
# Opt level: O0

void exedaem(voccxdef *ctx)

{
  undefined8 *in_RDI;
  errdef fr__1;
  errdef fr_;
  objnum thisd;
  int err;
  runsdef val;
  int i;
  vocddef *daemon;
  runcxdef *rcx;
  undefined4 in_stack_fffffffffffffd38;
  undefined4 in_stack_fffffffffffffd3c;
  undefined4 in_stack_fffffffffffffd40;
  undefined4 in_stack_fffffffffffffd44;
  dattyp in_stack_fffffffffffffd4c;
  runcxdef *in_stack_fffffffffffffd50;
  undefined8 local_2a8;
  int local_2a0;
  int in_stack_fffffffffffffe78;
  objnum in_stack_fffffffffffffe7e;
  runcxdef *in_stack_fffffffffffffe80;
  undefined8 local_170;
  int local_168;
  prpnum in_stack_fffffffffffffef0;
  objnum in_stack_fffffffffffffef2;
  prpnum in_stack_fffffffffffffef4;
  objnum in_stack_fffffffffffffef6;
  uchar **in_stack_fffffffffffffef8;
  runcxdef *in_stack_ffffffffffffff00;
  int in_stack_ffffffffffffff10;
  int in_stack_ffffffffffffff18;
  objnum in_stack_ffffffffffffff20;
  int local_1c;
  short *local_18;
  
  local_1c = *(int *)(in_RDI + 0x1e0);
  local_18 = (short *)in_RDI[0x1df];
  do {
    if (local_1c == 0) {
      local_1c = *(int *)(in_RDI + 0x1e4);
      local_18 = (short *)in_RDI[0x1e3];
      do {
        if (local_1c == 0) {
          return;
        }
        if ((*local_18 != -1) && (*(int *)(local_18 + 0xe) == 0xffff)) {
          local_2a0 = _setjmp((__jmp_buf_tag *)&stack0xfffffffffffffdc8);
          if (local_2a0 == 0) {
            local_2a8 = *(undefined8 *)*in_RDI;
            *(undefined8 **)*in_RDI = &local_2a8;
            in_stack_fffffffffffffd38 = 0;
            in_stack_fffffffffffffd40 = 0;
            runpprop(in_stack_ffffffffffffff00,in_stack_fffffffffffffef8,in_stack_fffffffffffffef6,
                     in_stack_fffffffffffffef4,in_stack_fffffffffffffef2,in_stack_fffffffffffffef0,
                     in_stack_ffffffffffffff10,in_stack_ffffffffffffff18,in_stack_ffffffffffffff20);
            *(undefined8 *)*in_RDI = local_2a8;
          }
          else {
            *(undefined8 *)*in_RDI = local_2a8;
            if ((local_2a0 != 0x3f5) && (local_2a0 != 0x3fb)) {
              errrse1((errcxdef *)CONCAT44(in_stack_fffffffffffffd44,in_stack_fffffffffffffd40),
                      (errdef *)CONCAT44(in_stack_fffffffffffffd3c,in_stack_fffffffffffffd38));
            }
          }
        }
        local_18 = local_18 + 0x10;
        local_1c = local_1c + -1;
      } while( true );
    }
    if (*local_18 != -1) {
      local_168 = _setjmp((__jmp_buf_tag *)&stack0xffffffffffffff00);
      if (local_168 == 0) {
        local_170 = *(undefined8 *)*in_RDI;
        *(undefined8 **)*in_RDI = &local_170;
        runpush(in_stack_fffffffffffffd50,in_stack_fffffffffffffd4c,
                (runsdef *)CONCAT44(in_stack_fffffffffffffd44,in_stack_fffffffffffffd40));
        runfn(in_stack_fffffffffffffe80,in_stack_fffffffffffffe7e,in_stack_fffffffffffffe78);
        *(undefined8 *)*in_RDI = local_170;
      }
      else {
        *(undefined8 *)*in_RDI = local_170;
        if ((local_168 != 0x3f5) && (local_168 != 0x3fb)) {
          errrse1((errcxdef *)CONCAT44(in_stack_fffffffffffffd44,in_stack_fffffffffffffd40),
                  (errdef *)CONCAT44(in_stack_fffffffffffffd3c,in_stack_fffffffffffffd38));
        }
      }
    }
    local_18 = local_18 + 0x10;
    local_1c = local_1c + -1;
  } while( true );
}

Assistant:

void exedaem(voccxdef *ctx)
{
    runcxdef *rcx = ctx->voccxrun;
    vocddef  *daemon;
    int       i;
    runsdef   val;
    int       err;

    for (i = ctx->voccxdmc, daemon = ctx->voccxdmn ; i ; ++daemon, --i)
    {
        if (daemon->vocdfn != MCMONINV)
        {
            objnum thisd = daemon->vocdfn;
            
            ERRBEGIN(ctx->voccxerr)

            OSCPYSTRUCT(val, daemon->vocdarg);
            runpush(rcx, val.runstyp, &val);
            runfn(rcx, thisd, 1);
            
            ERRCATCH(ctx->voccxerr, err)
                if (err != ERR_RUNEXIT && err != ERR_RUNEXITOBJ)
                    errrse(ctx->voccxerr);
            ERREND(ctx->voccxerr)
        }
    }
    for (i = ctx->voccxalc, daemon = ctx->voccxalm ; i ; ++daemon, --i)
    {
        if (daemon->vocdfn != MCMONINV
            && daemon->vocdtim == VOCDTIM_EACH_TURN)
        {
            ERRBEGIN(ctx->voccxerr)

            runppr(rcx, daemon->vocdfn, daemon->vocdprp, 0);
            
            ERRCATCH(ctx->voccxerr, err)
                if (err != ERR_RUNEXIT && err != ERR_RUNEXITOBJ)
                    errrse(ctx->voccxerr);
            ERREND(ctx->voccxerr)
        }
    }
}